

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring64_bitmap_add(roaring64_bitmap_t *r,uint64_t val)

{
  leaf_t *leaf;
  uint16_t low16;
  uint8_t high48 [6];
  roaring64_bitmap_t *in_stack_00000028;
  art_t *in_stack_ffffffffffffffd8;
  uint64_t in_stack_ffffffffffffffe0;
  
  split_key(in_stack_ffffffffffffffe0,(uint8_t *)in_stack_ffffffffffffffd8);
  art_find(in_stack_ffffffffffffffd8,(art_key_chunk_t *)0x13f751);
  containerptr_roaring64_bitmap_add(in_stack_00000028,(uint8_t *)r,val._6_2_,_low16);
  return;
}

Assistant:

void roaring64_bitmap_add(roaring64_bitmap_t *r, uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    leaf_t *leaf = (leaf_t *)art_find(&r->art, high48);
    containerptr_roaring64_bitmap_add(r, high48, low16, leaf);
}